

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O2

void __thiscall deqp::gls::BufferTestUtil::BufferCase::checkError(BufferCase *this)

{
  TestError *this_00;
  allocator<char> local_89;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  code *local_28;
  GLenum local_20;
  
  local_20 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
  if (local_20 == 0) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Got ",&local_89);
  local_28 = glu::getErrorName;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_28);
  std::operator+(&local_48,&local_68,&local_88);
  tcu::TestError::TestError(this_00,&local_48);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BufferCase::checkError (void)
{
	glw::GLenum err = glGetError();
	if (err != GL_NO_ERROR)
		throw tcu::TestError(string("Got ") + glu::getErrorStr(err).toString());
}